

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O0

Download * __thiscall Download::GetFileExtensionName(Download *this,string *url)

{
  ulong uVar1;
  string *in_RDX;
  string local_88 [32];
  long local_68;
  size_t index;
  string local_58 [8];
  string extensionSeparator;
  allocator local_22;
  byte local_21;
  string *local_20;
  string *url_local;
  Download *this_local;
  string *fileExtensionName;
  
  local_21 = 0;
  local_20 = in_RDX;
  url_local = url;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,".",(allocator *)((long)&index + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (local_68 = std::__cxx11::string::rfind(local_20,(ulong)local_58), local_68 != -1)) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_20);
    std::__cxx11::string::operator=((string *)this,local_88);
    std::__cxx11::string::~string(local_88);
  }
  local_21 = 1;
  std::__cxx11::string::~string(local_58);
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

std::string Download::GetFileExtensionName(const std::string &url)
{ 
	std::string fileExtensionName="";
	std::string extensionSeparator = ".";
	if(!url.empty())
	{
		size_t index = url.rfind(extensionSeparator);
		if(index != std::string::npos)
		{
			fileExtensionName = url.substr(index+extensionSeparator.length());
		}
	}
	return fileExtensionName;
}